

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O1

void Cmd_printspans(FCommandLine *argv,APlayerPawn *who,int key)

{
  ushort uVar1;
  FTexture *pFVar2;
  int iVar3;
  FTextureID FVar4;
  ushort *in_RAX;
  char *pcVar5;
  uint uVar6;
  Span *spans;
  ushort *local_38;
  
  local_38 = in_RAX;
  iVar3 = FCommandLine::argc(argv);
  if (iVar3 == 2) {
    pcVar5 = FCommandLine::operator[](argv,1);
    FVar4 = FTextureManager::CheckForTexture(&TexMan,pcVar5,0,1);
    if (FVar4.texnum < 0) {
      pcVar5 = FCommandLine::operator[](argv,1);
      Printf("Unknown texture %s\n",pcVar5);
      return;
    }
    pFVar2 = TexMan.Textures.Array[(uint)FVar4.texnum].Texture;
    if (pFVar2->Width != 0) {
      uVar6 = 0;
      do {
        Printf("%4d:",(ulong)uVar6);
        (*pFVar2->_vptr_FTexture[2])(pFVar2,(ulong)uVar6,&local_38);
        uVar1 = local_38[1];
        while (uVar1 != 0) {
          Printf(" (%4d,%4d)",(ulong)*local_38,(ulong)(((uint)uVar1 + (uint)*local_38) - 1));
          uVar1 = local_38[3];
          local_38 = local_38 + 2;
        }
        Printf("\n");
        uVar6 = uVar6 + 1;
      } while (uVar6 < pFVar2->Width);
    }
  }
  return;
}

Assistant:

CCMD (printspans)
{
	if (argv.argc() != 2)
		return;

	FTextureID picnum = TexMan.CheckForTexture (argv[1], FTexture::TEX_Any);
	if (!picnum.Exists())
	{
		Printf ("Unknown texture %s\n", argv[1]);
		return;
	}
	FTexture *tex = TexMan[picnum];
	for (int x = 0; x < tex->GetWidth(); ++x)
	{
		const FTexture::Span *spans;
		Printf ("%4d:", x);
		tex->GetColumn (x, &spans);
		while (spans->Length != 0)
		{
			Printf (" (%4d,%4d)", spans->TopOffset, spans->TopOffset+spans->Length-1);
			spans++;
		}
		Printf ("\n");
	}
}